

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

void __thiscall clickhouse::SocketOutput::DoWrite(SocketOutput *this,void *data,size_t len)

{
  int __v;
  size_t sVar1;
  system_error *this_00;
  int *piVar2;
  error_category *__ecat;
  
  sVar1 = send(this->s_,data,(long)(int)len,0x4000);
  if (sVar1 == (long)(int)len) {
    return;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  __v = *piVar2;
  __ecat = (error_category *)std::_V2::system_category();
  std::system_error::system_error(this_00,__v,__ecat,"fail to send data");
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void SocketOutput::DoWrite(const void* data, size_t len) {
#if defined (_linux_)
    static const int flags = MSG_NOSIGNAL;
#else
    static const int flags = 0;
#endif

    if (::send(s_, (const char*)data, (int)len, flags) != (int)len) {
        throw std::system_error(
            errno, std::system_category(), "fail to send data"
        );
    }
}